

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Displacement.cpp
# Opt level: O0

int __thiscall
OpenMD::DisplacementZ::computeProperty1(DisplacementZ *this,int frame,StuntDouble *sd)

{
  bool bVar1;
  reference pvVar2;
  double *pdVar3;
  size_type sVar4;
  int in_ESI;
  long in_RDI;
  double dVar5;
  value_type_conflict2 *__x;
  Vector3d *in_stack_00000008;
  Snapshot *in_stack_00000010;
  int zBin;
  Vector3d pos;
  value_type *in_stack_ffffffffffffff88;
  double dVar6;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_ffffffffffffff90;
  StuntDouble *in_stack_ffffffffffffff98;
  Vector<double,_3U> local_30;
  int local_c;
  
  local_c = in_ESI;
  StuntDouble::getPos(in_stack_ffffffffffffff98);
  pvVar2 = std::
           vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                         *)(in_RDI + 0xe40),(long)local_c);
  StuntDouble::getPos(in_stack_ffffffffffffff98);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 0x98));
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1475cd);
  if (bVar1) {
    Snapshot::wrapVector(in_stack_00000010,in_stack_00000008);
  }
  dVar5 = (double)*(uint *)(in_RDI + 0xef0);
  dVar6 = *(double *)(in_RDI + 0xee8);
  pdVar3 = Vector<double,_3U>::operator[](&local_30,*(uint *)(in_RDI + 0xef4));
  __x = (value_type_conflict2 *)(dVar5 * (dVar6 + *pdVar3));
  RectMatrix<double,_3U,_3U>::operator()
            ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0xea0),*(uint *)(in_RDI + 0xef4),
             *(uint *)(in_RDI + 0xef4));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(in_RDI + 0xe58),(long)local_c);
  std::vector<int,_std::allocator<int>_>::push_back((vector<int,_std::allocator<int>_> *)pvVar2,__x)
  ;
  pvVar2 = std::
           vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                         *)(in_RDI + 0xe40),(long)local_c);
  sVar4 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                    (pvVar2);
  return (int)sVar4 + -1;
}

Assistant:

int DisplacementZ::computeProperty1(int frame, StuntDouble* sd) {
    Vector3d pos = sd->getPos();
    // we need the raw (not wrapped) positions for RMSD:
    positions_[frame].push_back(sd->getPos());

    if (info_->getSimParams()->getUsePeriodicBoundaryConditions()) {
      currentSnapshot_->wrapVector(pos);
    }
    int zBin = int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat_(axis_, axis_));
    zBins_[frame].push_back(zBin);

    return positions_[frame].size() - 1;
  }